

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

BOOL Js::JavascriptOperators::SetItem
               (Var receiver,RecyclableObject *object,uint32 index,Var value,
               ScriptContext *scriptContext,PropertyOperationFlags propertyOperationFlags,
               BOOL skipPrototypeCheck)

{
  code *pcVar1;
  PropertyRecord *this;
  bool bVar2;
  BOOL BVar3;
  PropertyId propertyId;
  ThreadContext *this_00;
  undefined4 *puVar4;
  RecyclableObject *pRVar5;
  PropertyRecord *local_68;
  PropertyRecord *propertyRecord;
  JavascriptProxy *proxy;
  RecyclableObject *func;
  Var pvStack_48;
  DescriptorFlags flags;
  Var setterValueOrProxy;
  ScriptContext *pSStack_38;
  PropertyOperationFlags propertyOperationFlags_local;
  ScriptContext *scriptContext_local;
  Var value_local;
  RecyclableObject *pRStack_20;
  uint32 index_local;
  RecyclableObject *object_local;
  Var receiver_local;
  
  pvStack_48 = (Var)0x0;
  func._4_4_ = 0;
  setterValueOrProxy._4_4_ = propertyOperationFlags;
  pSStack_38 = scriptContext;
  scriptContext_local = (ScriptContext *)value;
  value_local._4_4_ = index;
  pRStack_20 = object;
  object_local = (RecyclableObject *)receiver;
  bVar2 = TaggedNumber::Is(receiver);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0xd95,"(!TaggedNumber::Is(receiver))","!TaggedNumber::Is(receiver)"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  BVar3 = CheckPrototypesForAccessorOrNonWritableItem
                    (pRStack_20,value_local._4_4_,&stack0xffffffffffffffb8,
                     (DescriptorFlags *)((long)&func + 4),pSStack_38,skipPrototypeCheck);
  if (BVar3 == 0) {
    BVar3 = IsObject(object_local);
    if (BVar3 == 0) {
      JavascriptError::ThrowCantAssignIfStrictMode(setterValueOrProxy._4_4_,pSStack_38);
      receiver_local._4_4_ = 0;
    }
    else {
      pRVar5 = VarTo<Js::RecyclableObject>(object_local);
      receiver_local._4_4_ =
           (*(pRVar5->super_FinalizableObject).super_IRecyclerVisitedObject.
             _vptr_IRecyclerVisitedObject[0x29])
                     (pRVar5,(ulong)value_local._4_4_,scriptContext_local,
                      (ulong)setterValueOrProxy._4_4_);
    }
  }
  else {
    this_00 = ScriptContext::GetThreadContext(pSStack_38);
    ThreadContext::AddImplicitCallFlags(this_00,ImplicitCall_NoOpSet);
    if ((func._4_4_ & 1) == 1) {
      bVar2 = JavascriptError::ThrowIfStrictModeUndefinedSetter
                        (setterValueOrProxy._4_4_,pvStack_48,pSStack_38);
      if ((bVar2) ||
         (bVar2 = JavascriptError::ThrowIfNotExtensibleUndefinedSetter
                            (setterValueOrProxy._4_4_,pvStack_48,pSStack_38), bVar2)) {
        receiver_local._4_4_ = 1;
      }
      else {
        if (pvStack_48 != (Var)0x0) {
          proxy = (JavascriptProxy *)VarTo<Js::RecyclableObject>(pvStack_48);
          CallSetter((RecyclableObject *)proxy,object_local,scriptContext_local,pSStack_38);
        }
        receiver_local._4_4_ = 1;
      }
    }
    else if ((func._4_4_ & 0x10) == 0x10) {
      bVar2 = VarIs<Js::JavascriptProxy>(pvStack_48);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0xda9,"(VarIs<JavascriptProxy>(setterValueOrProxy))",
                                    "VarIs<JavascriptProxy>(setterValueOrProxy)");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      propertyRecord = (PropertyRecord *)VarTo<Js::JavascriptProxy>(pvStack_48);
      local_68 = (PropertyRecord *)0x0;
      Js::JavascriptProxy::PropertyIdFromInt
                ((JavascriptProxy *)propertyRecord,value_local._4_4_,&local_68);
      pRVar5 = object_local;
      this = propertyRecord;
      propertyId = PropertyRecord::GetPropertyId(local_68);
      receiver_local._4_4_ =
           Js::JavascriptProxy::SetPropertyTrap
                     ((JavascriptProxy *)this,pRVar5,SetItemKind,propertyId,scriptContext_local,
                      pSStack_38,setterValueOrProxy._4_4_,skipPrototypeCheck);
    }
    else {
      if (((func._4_4_ & 2) != 2) || ((func._4_4_ & 4) != 0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0xdb1,"((flags & Data) == Data && (flags & Writable) == None)",
                                    "(flags & Data) == Data && (flags & Writable) == None");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      if ((setterValueOrProxy._4_4_ & PropertyOperation_ThrowIfNotExtensible) ==
          PropertyOperation_ThrowIfNotExtensible) {
        JavascriptError::ThrowTypeError(pSStack_38,-0x7ff5ec4a,(PCWSTR)0x0);
      }
      JavascriptError::ThrowCantAssign(setterValueOrProxy._4_4_,pSStack_38,value_local._4_4_);
      JavascriptError::ThrowCantAssignIfStrictMode(setterValueOrProxy._4_4_,pSStack_38);
      receiver_local._4_4_ = 0;
    }
  }
  return receiver_local._4_4_;
}

Assistant:

BOOL JavascriptOperators::SetItem(Var receiver, RecyclableObject* object, uint32 index, Var value, ScriptContext* scriptContext, PropertyOperationFlags propertyOperationFlags, BOOL skipPrototypeCheck /* = FALSE */)
    {
        Var setterValueOrProxy = nullptr;
        DescriptorFlags flags = None;
        Assert(!TaggedNumber::Is(receiver));
        if (JavascriptOperators::CheckPrototypesForAccessorOrNonWritableItem(object, index, &setterValueOrProxy, &flags, scriptContext, skipPrototypeCheck))
        {
            scriptContext->GetThreadContext()->AddImplicitCallFlags(ImplicitCall_NoOpSet);
            if ((flags & Accessor) == Accessor)
            {
                if (JavascriptError::ThrowIfStrictModeUndefinedSetter(propertyOperationFlags, setterValueOrProxy, scriptContext) ||
                    JavascriptError::ThrowIfNotExtensibleUndefinedSetter(propertyOperationFlags, setterValueOrProxy, scriptContext))
                {
                    return TRUE;
                }
                if (setterValueOrProxy)
                {
                    RecyclableObject* func = VarTo<RecyclableObject>(setterValueOrProxy);
                    JavascriptOperators::CallSetter(func, receiver, value, scriptContext);
                }
                return TRUE;
            }
            else if ((flags & Proxy) == Proxy)
            {
                Assert(VarIs<JavascriptProxy>(setterValueOrProxy));
                JavascriptProxy* proxy = VarTo<JavascriptProxy>(setterValueOrProxy);
                const PropertyRecord* propertyRecord = nullptr;
                proxy->PropertyIdFromInt(index, &propertyRecord);
                return proxy->SetPropertyTrap(receiver, JavascriptProxy::SetPropertyTrapKind::SetItemKind, propertyRecord->GetPropertyId(), value, scriptContext, propertyOperationFlags, skipPrototypeCheck);
            }
            else
            {
                Assert((flags & Data) == Data && (flags & Writable) == None);
                if ((propertyOperationFlags & PropertyOperationFlags::PropertyOperation_ThrowIfNotExtensible) == PropertyOperationFlags::PropertyOperation_ThrowIfNotExtensible)
                {
                    JavascriptError::ThrowTypeError(scriptContext, JSERR_NonExtensibleObject);
                }

                JavascriptError::ThrowCantAssign(propertyOperationFlags, scriptContext, index);
                JavascriptError::ThrowCantAssignIfStrictMode(propertyOperationFlags, scriptContext);
                return FALSE;
            }
        }
        else if (!JavascriptOperators::IsObject(receiver))
        {
            JavascriptError::ThrowCantAssignIfStrictMode(propertyOperationFlags, scriptContext);
            return FALSE;
        }

        return (VarTo<RecyclableObject>(receiver))->SetItem(index, value, propertyOperationFlags);
    }